

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O0

int VariableLevelCost(int level,uint8_t *probas)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  int i;
  int cost;
  int bits;
  int pattern;
  int local_20;
  int local_1c;
  uint local_18;
  uint local_14;
  
  local_18 = (uint)VP8LevelCodes[in_EDI + -1][1];
  local_1c = 0;
  local_20 = 2;
  for (local_14 = (uint)VP8LevelCodes[in_EDI + -1][0]; local_14 != 0; local_14 = (int)local_14 >> 1)
  {
    if ((local_14 & 1) != 0) {
      iVar1 = VP8BitCost(local_18 & 1,*(uint8_t *)(in_RSI + local_20));
      local_1c = iVar1 + local_1c;
    }
    local_18 = (int)local_18 >> 1;
    local_20 = local_20 + 1;
  }
  return local_1c;
}

Assistant:

static int VariableLevelCost(int level, const uint8_t probas[NUM_PROBAS]) {
  int pattern = VP8LevelCodes[level - 1][0];
  int bits = VP8LevelCodes[level - 1][1];
  int cost = 0;
  int i;
  for (i = 2; pattern; ++i) {
    if (pattern & 1) {
      cost += VP8BitCost(bits & 1, probas[i]);
    }
    bits >>= 1;
    pattern >>= 1;
  }
  return cost;
}